

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string_view cmSystemTools::GetSystemName(void)

{
  string_view val;
  string_view sVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  undefined1 local_100 [8];
  RegularExpressionMatch match;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  if (GetSystemName::initialized) {
    local_18._M_len = GetSystemName::systemName._M_len;
    local_18._M_str = GetSystemName::systemName._M_str;
  }
  else {
    iVar3 = uname((utsname *)&GetSystemName::uts_name);
    if (iVar3 < 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_18,"");
    }
    else {
      GetSystemName::initialized = true;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_28,GetSystemName::uts_name.sysname);
      GetSystemName::systemName._M_len = local_28._M_len;
      GetSystemName::systemName._M_str = local_28._M_str;
      local_38 = local_28._M_len;
      local_30 = local_28._M_str;
      val._M_str = local_28._M_str;
      val._M_len = local_28._M_len;
      bVar2 = cmIsOff(val);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_48,"UnknownOS");
        GetSystemName::systemName._M_len = local_48._M_len;
        GetSystemName::systemName._M_str = local_48._M_str;
      }
      if ((GetSystemName()::bsdOsRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetSystemName()::bsdOsRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression(&GetSystemName::bsdOsRegex,"BSD.OS");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetSystemName::bsdOsRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetSystemName()::bsdOsRegex);
      }
      cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_100);
      bVar2 = cmsys::RegularExpression::find
                        (&GetSystemName::bsdOsRegex,GetSystemName::uts_name.sysname,
                         (RegularExpressionMatch *)local_100);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"BSDOS")
        ;
        GetSystemName::systemName._M_len = local_110._M_len;
        GetSystemName::systemName._M_str = local_110._M_str;
      }
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"kFreeBSD",0);
      if (sVar4 != 0xffffffffffffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_120,"kFreeBSD");
        GetSystemName::systemName._M_len = local_120._M_len;
        GetSystemName::systemName._M_str = local_120._M_str;
      }
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"CYGWIN",0);
      if (sVar4 != 0xffffffffffffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_130,"CYGWIN");
        GetSystemName::systemName._M_len = local_130._M_len;
        GetSystemName::systemName._M_str = local_130._M_str;
      }
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"MSYS",0);
      if (sVar4 != 0xffffffffffffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_140,"MSYS");
        GetSystemName::systemName._M_len = local_140._M_len;
        GetSystemName::systemName._M_str = local_140._M_str;
      }
      local_18._M_len = GetSystemName::systemName._M_len;
      local_18._M_str = GetSystemName::systemName._M_str;
    }
  }
  sVar1._M_str = local_18._M_str;
  sVar1._M_len = local_18._M_len;
  return sVar1;
}

Assistant:

cm::string_view cmSystemTools::GetSystemName()
{
#if defined(_WIN32)
  return "Windows";
#elif defined(__ANDROID__)
  return "Android";
#else
  static struct utsname uts_name;
  static bool initialized = false;
  static cm::string_view systemName;
  if (initialized) {
    return systemName;
  }
  if (uname(&uts_name) >= 0) {
    initialized = true;
    systemName = uts_name.sysname;

    if (cmIsOff(systemName)) {
      systemName = "UnknownOS";
    }

    // fix for BSD/OS, remove the /
    static const cmsys::RegularExpression bsdOsRegex("BSD.OS");
    cmsys::RegularExpressionMatch match;
    if (bsdOsRegex.find(uts_name.sysname, match)) {
      systemName = "BSDOS";
    }

    // fix for GNU/kFreeBSD, remove the GNU/
    if (systemName.find("kFreeBSD") != cm::string_view::npos) {
      systemName = "kFreeBSD";
    }

    // fix for CYGWIN and MSYS which have windows version in them
    if (systemName.find("CYGWIN") != cm::string_view::npos) {
      systemName = "CYGWIN";
    }

    if (systemName.find("MSYS") != cm::string_view::npos) {
      systemName = "MSYS";
    }
    return systemName;
  }
  return "";
#endif
}